

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<7,2>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<7,2> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_7_2_hpp:67:43),_const_std::variant<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>_&>
  _Var1;
  int MT;
  undefined4 local_98;
  int local_94;
  double local_90;
  double local_88;
  int local_7c;
  StructureDivision local_78;
  
  local_98 = 2;
  local_88 = (double)*(int *)this;
  local_90 = *(double *)(this + 8);
  local_94 = MAT;
  local_7c = MF;
  _Var1 = std::
          visit<njoy::ENDFtk::section::Type<7,2>::LTHR()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>const&>
                    ((anon_class_1_0_00000001 *)&local_78,
                     (variant<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                      *)(this + 0x10));
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)_Var1;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_90;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_88;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_78,it,MAT,MF,2);
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)&local_94;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)it;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_7c;
  local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&local_98;
  std::
  visit<njoy::ENDFtk::section::Type<7,2>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>const&>
            ((anon_class_32_4_f17ee1e6 *)&local_78,
             (variant<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
              *)(this + 0x10));
  sectionEndRecord(&local_78,local_94,local_7c);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {
  int MT = 2;
  ControlRecord( this->ZA(), this->AWR(), this->LTHR(), 0, 
                 0, 0 ).print( it, MAT, MF, MT );
  std::visit( [&] ( const auto& v ) -> void
                  { v.print( it, MAT, MF, MT ); },
              this->law_ );
  SEND( MAT, MF ).print( it );
}